

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (tuple<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  char cVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  runtime_error *this;
  text *this_00;
  pointer __rhs;
  text opt;
  int local_1dc;
  seed_t local_180;
  text val;
  texts in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  text local_110;
  text local_f0;
  text local_d0;
  text local_b0;
  text local_90;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __rhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = true;
  local_1dc = 1;
  bVar5 = false;
  bVar6 = false;
  bVar8 = false;
  bVar7 = false;
  bVar9 = false;
  bVar11 = false;
  bVar12 = false;
  bVar15 = false;
  bVar16 = false;
  bVar13 = false;
  bVar14 = false;
  local_180 = 0;
  bVar4 = false;
  do {
    if (__rhs == pbVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)__return_storage_ptr__,&in);
      bVar3 = true;
      if (!bVar11) {
        bVar3 = bVar12;
      }
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.help = bVar4;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.abort = bVar5;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.count = bVar6;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.list = bVar8;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.tags = bVar7;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.time = bVar9;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.pass = bVar3;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.zen = bVar12;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.lexical = bVar15;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.random = bVar16;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.verbose = bVar13;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.version = bVar14;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.repeat = local_1dc;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).super__Head_base<0UL,_lest::options,_false>._M_head_impl.seed = local_180;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&in);
      return __return_storage_ptr__;
    }
    if (bVar3) {
      opt._M_dataplus._M_p = (pointer)&opt.field_2;
      opt._M_string_length = 0;
      opt.field_2._M_local_buf[0] = '\0';
      val._M_dataplus._M_p = (pointer)&val.field_2;
      val._M_string_length = 0;
      val.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)&local_90,(string *)__rhs);
      split_option((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,&local_90);
      local_130._M_dataplus._M_p = (pointer)&val;
      local_130._M_string_length = (size_type)&opt;
      std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
                ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_130,
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70);
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Tuple_impl(&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      cVar1 = *opt._M_dataplus._M_p;
      if ((cVar1 != '-') || (bVar3 = std::operator==(&opt,"--"), bVar3)) {
        bVar3 = false;
      }
      else {
        bVar3 = std::operator==(&opt,"-h");
        if ((bVar3) || (bVar3 = std::operator==("--help",&opt), bVar3)) {
          bVar3 = true;
          bVar4 = true;
        }
        else {
          bVar3 = std::operator==(&opt,"-a");
          if ((bVar3) || (bVar3 = std::operator==("--abort",&opt), bVar3)) {
            bVar3 = true;
            bVar5 = true;
          }
          else {
            bVar3 = std::operator==(&opt,"-c");
            if ((bVar3) || (bVar3 = std::operator==("--count",&opt), bVar3)) {
              bVar3 = true;
              bVar6 = true;
            }
            else {
              bVar3 = std::operator==(&opt,"-g");
              if ((bVar3) || (bVar3 = std::operator==("--list-tags",&opt), bVar3)) {
                bVar3 = true;
                bVar7 = true;
              }
              else {
                bVar3 = std::operator==(&opt,"-l");
                if ((bVar3) || (bVar3 = std::operator==("--list-tests",&opt), bVar3)) {
                  bVar3 = true;
                  bVar8 = true;
                }
                else {
                  bVar3 = std::operator==(&opt,"-t");
                  if ((bVar3) || (bVar3 = std::operator==("--time",&opt), bVar3)) {
                    bVar3 = true;
                    bVar9 = true;
                  }
                  else {
                    bVar10 = std::operator==(&opt,"-p");
                    bVar3 = true;
                    if ((bVar10) || (bVar10 = std::operator==("--pass",&opt), bVar10)) {
                      bVar11 = true;
                    }
                    else {
                      bVar3 = std::operator==(&opt,"-z");
                      if ((bVar3) || (bVar3 = std::operator==("--pass-zen",&opt), bVar3)) {
                        bVar3 = true;
                        bVar12 = true;
                      }
                      else {
                        bVar3 = std::operator==(&opt,"-v");
                        if ((bVar3) || (bVar3 = std::operator==("--verbose",&opt), bVar3)) {
                          bVar3 = true;
                          bVar13 = true;
                        }
                        else {
                          bVar10 = std::operator==("--version",&opt);
                          bVar3 = true;
                          if (bVar10) {
                            bVar14 = true;
                          }
                          else {
                            bVar10 = std::operator==(&opt,"--order");
                            if ((!bVar10) || (bVar10 = std::operator==("declared",&val), !bVar10)) {
                              bVar10 = std::operator==(&opt,"--order");
                              if ((bVar10) && (bVar10 = std::operator==("lexical",&val), bVar10)) {
                                bVar15 = true;
                              }
                              else {
                                bVar10 = std::operator==(&opt,"--order");
                                if ((!bVar10) || (bVar10 = std::operator==("random",&val), !bVar10))
                                {
                                  bVar10 = std::operator==(&opt,"--random-seed");
                                  if (bVar10) {
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_b0,"--random-seed",
                                               (allocator<char> *)&local_70);
                                    std::__cxx11::string::string((string *)&local_d0,(string *)&val)
                                    ;
                                    local_180 = seed(&local_b0,&local_d0);
                                    std::__cxx11::string::~string((string *)&local_d0);
                                    this_00 = &local_b0;
                                  }
                                  else {
                                    bVar10 = std::operator==(&opt,"--repeat");
                                    if (!bVar10) {
                                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                                      std::operator+(&local_130,"unrecognised option \'",__rhs);
                                      std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_70,&local_130,"\' (try option --help)");
                                      std::runtime_error::runtime_error(this,(string *)&local_70);
                                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                                  std::runtime_error::~runtime_error);
                                    }
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_f0,"--repeat",
                                               (allocator<char> *)&local_70);
                                    std::__cxx11::string::string
                                              ((string *)&local_110,(string *)&val);
                                    local_1dc = repeat(&local_f0,&local_110);
                                    std::__cxx11::string::~string((string *)&local_110);
                                    this_00 = &local_f0;
                                  }
                                  std::__cxx11::string::~string((string *)this_00);
                                  goto LAB_0010a590;
                                }
                                bVar16 = true;
                              }
                              bVar3 = true;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0010a590:
      std::__cxx11::string::~string((string *)&val);
      std::__cxx11::string::~string((string *)&opt);
      if (cVar1 != '-') goto LAB_0010a5b7;
    }
    else {
      bVar3 = false;
LAB_0010a5b7:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&in,__rhs);
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

inline auto split_arguments( texts args ) -> std::tuple<options, texts>
{
    options option; texts in;

    bool in_options = true;

    for ( auto & arg : args )
    {
        if ( in_options )
        {
            text opt, val;
            std::tie( opt, val ) = split_option( arg );

            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + arg + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_tuple( option, in );
}